

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alpha_enc.c
# Opt level: O3

int CompressAlphaJob(void *arg1,void *unused)

{
  int effort_level;
  uint method;
  uint uVar1;
  uint dst_stride;
  uint height;
  undefined4 uVar2;
  long lVar3;
  int *piVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [14];
  undefined1 auVar7 [12];
  unkbyte10 Var8;
  bool bVar9;
  int iVar10;
  WEBP_FILTER_TYPE WVar11;
  uint8_t *dst;
  ulong uVar12;
  long lVar13;
  uint8_t *tmp_alpha;
  uint8_t *puVar14;
  ulong uVar15;
  uint uVar16;
  char cVar17;
  long lVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar31 [16];
  undefined1 auVar34 [16];
  VP8BitWriter *local_268;
  uint64_t local_240;
  long local_238;
  size_t local_230;
  FilterTrial best;
  FilterTrial local_128;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar32 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar33 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined2 uVar35;
  
  lVar18 = *arg1;
  lVar3 = *(long *)((long)arg1 + 8);
  effort_level = *(int *)(lVar18 + 8);
  method = *(uint *)(lVar18 + 0x30);
  uVar1 = *(uint *)(lVar18 + 0x38);
  dst_stride = *(uint *)(lVar3 + 8);
  height = *(uint *)(lVar3 + 0xc);
  local_240 = 0;
  if (1 < method || 100 < uVar1) {
    return 0;
  }
  cVar17 = (*(int *)(lVar18 + 0x34) == 1) + '\x05';
  if (*(int *)(lVar18 + 0x34) == 0) {
    cVar17 = '\0';
  }
  local_230 = (size_t)(int)(height * dst_stride);
  if (method == 0) {
    cVar17 = '\0';
  }
  dst = (uint8_t *)WebPSafeMalloc(1,local_230);
  if (dst == (uint8_t *)0x0) {
    return 0;
  }
  WebPCopyPlane(*(uint8_t **)(lVar3 + 0x30),*(int *)(lVar3 + 0x38),dst,dst_stride,dst_stride,height)
  ;
  if ((int)uVar1 < 100) {
    if (uVar1 < 0x47) {
      uVar16 = (uint)(byte)((char)((uVar1 & 0xff) / 5) + 2);
    }
    else {
      uVar16 = uVar1 * 8 - 0x220;
    }
    iVar10 = QuantizeLevels(dst,dst_stride,height,uVar16,&local_240);
    if (iVar10 == 0) {
      WebPSafeFree(dst);
      return 0;
    }
  }
  VP8FiltersInit();
  lVar18 = *(long *)(lVar3 + 0x80);
  if (cVar17 == '\x06') {
    memset(&best,0,0x100);
    if (0 < (int)height) {
      uVar12 = 0;
      puVar14 = dst;
      do {
        if (0 < (int)dst_stride) {
          uVar15 = 0;
          do {
            *(undefined1 *)((long)best.stats.PSNR + ((ulong)puVar14[uVar15] - 0x3c)) = 1;
            uVar15 = uVar15 + 1;
          } while (dst_stride != uVar15);
        }
        uVar12 = uVar12 + 1;
        puVar14 = puVar14 + (int)dst_stride;
      } while (uVar12 != height);
    }
    lVar13 = 0;
    iVar10 = 0;
    iVar19 = 0;
    iVar20 = 0;
    iVar21 = 0;
    do {
      uVar2 = *(undefined4 *)((long)best.stats.PSNR + lVar13 + -0x3c);
      auVar22[0] = -((char)uVar2 == '\0');
      auVar22[1] = -((char)((uint)uVar2 >> 8) == '\0');
      auVar22[2] = -((char)((uint)uVar2 >> 0x10) == '\0');
      auVar22[3] = -((char)((uint)uVar2 >> 0x18) == '\0');
      auVar22[4] = 0xff;
      auVar22[5] = 0xff;
      auVar22[6] = 0xff;
      auVar22[7] = 0xff;
      auVar22[8] = 0xff;
      auVar22[9] = 0xff;
      auVar22[10] = 0xff;
      auVar22[0xb] = 0xff;
      auVar22[0xc] = 0xff;
      auVar22[0xd] = 0xff;
      auVar22[0xe] = 0xff;
      auVar22[0xf] = 0xff;
      auVar5._8_4_ = 0xffffffff;
      auVar5._0_8_ = 0xffffffffffffffff;
      auVar5._12_4_ = 0xffffffff;
      auVar22 = auVar22 ^ auVar5;
      auVar30._0_14_ = auVar22._0_14_;
      auVar30[0xe] = auVar22[7];
      auVar30[0xf] = auVar22[7];
      auVar29._14_2_ = auVar30._14_2_;
      auVar29._0_13_ = auVar22._0_13_;
      auVar29[0xd] = auVar22[6];
      auVar28._13_3_ = auVar29._13_3_;
      auVar28._0_12_ = auVar22._0_12_;
      auVar28[0xc] = auVar22[6];
      auVar27._12_4_ = auVar28._12_4_;
      auVar27._0_11_ = auVar22._0_11_;
      auVar27[0xb] = auVar22[5];
      auVar26._11_5_ = auVar27._11_5_;
      auVar26._0_10_ = auVar22._0_10_;
      auVar26[10] = auVar22[5];
      auVar25._10_6_ = auVar26._10_6_;
      auVar25._0_9_ = auVar22._0_9_;
      auVar25[9] = auVar22[4];
      auVar24._9_7_ = auVar25._9_7_;
      auVar24._0_8_ = auVar22._0_8_;
      auVar24[8] = auVar22[4];
      Var8 = CONCAT91(CONCAT81(auVar24._8_8_,auVar22[3]),auVar22[3]);
      auVar7._2_10_ = Var8;
      auVar7[1] = auVar22[2];
      auVar7[0] = auVar22[2];
      auVar6._2_12_ = auVar7;
      auVar6[1] = auVar22[1];
      auVar6[0] = auVar22[1];
      auVar23._0_2_ = CONCAT11(auVar22[0],auVar22[0]);
      auVar23._2_14_ = auVar6;
      uVar35 = (undefined2)Var8;
      auVar33._0_12_ = auVar23._0_12_;
      auVar33._12_2_ = uVar35;
      auVar33._14_2_ = uVar35;
      auVar32._12_4_ = auVar33._12_4_;
      auVar32._0_10_ = auVar23._0_10_;
      auVar32._10_2_ = auVar7._0_2_;
      auVar31._10_6_ = auVar32._10_6_;
      auVar31._0_8_ = auVar23._0_8_;
      auVar31._8_2_ = auVar7._0_2_;
      auVar34._8_8_ = auVar31._8_8_;
      auVar34._6_2_ = auVar6._0_2_;
      auVar34._4_2_ = auVar6._0_2_;
      auVar34._2_2_ = auVar23._0_2_;
      auVar34._0_2_ = auVar23._0_2_;
      auVar34 = auVar34 & _DAT_00154a30;
      iVar10 = iVar10 + auVar34._0_4_;
      iVar19 = iVar19 + auVar34._4_4_;
      iVar20 = iVar20 + auVar34._8_4_;
      iVar21 = iVar21 + auVar34._12_4_;
      lVar13 = lVar13 + 4;
    } while (lVar13 != 0x100);
    uVar16 = iVar21 + iVar19 + iVar20 + iVar10;
    WVar11 = WEBP_FILTER_NONE;
    if (0x10 < uVar16) {
      WVar11 = WebPEstimateBestFilter(dst,dst_stride,height,dst_stride);
    }
    uVar16 = (uint)(0xc0 < uVar16 || 3 < effort_level) | 1 << (WVar11 & 0x1f);
    best.score = 0xffffffff;
    VP8BitWriterInit(&best.bw,0);
    if (uVar16 == 1) goto LAB_00136a53;
LAB_00136a9f:
    local_268 = &best.bw;
    local_238 = lVar18;
    tmp_alpha = (uint8_t *)WebPSafeMalloc(1,local_230);
    puVar14 = (uint8_t *)0x0;
    if (tmp_alpha == (uint8_t *)0x0) {
      bVar9 = true;
      best.bw.pos_ = 0;
      goto LAB_00136be9;
    }
    do {
      iVar10 = 1;
      if ((uVar16 & 1) != 0) {
        iVar10 = EncodeAlphaInternal(dst,dst_stride,height,method,(int)puVar14,
                                     (uint)((int)uVar1 < 100),effort_level,tmp_alpha,&local_128);
        if ((iVar10 == 0) || (best.score <= local_128.score)) {
          VP8BitWriterWipeOut(&local_128.bw);
        }
        else {
          VP8BitWriterWipeOut(local_268);
          memcpy(&best,&local_128,0xf8);
        }
      }
      if (uVar16 < 2) break;
      puVar14 = (uint8_t *)(ulong)((int)puVar14 + 1);
      uVar16 = uVar16 >> 1;
    } while (iVar10 != 0);
    WebPSafeFree(tmp_alpha);
    lVar18 = local_238;
  }
  else {
    if (cVar17 != '\0') {
      best.score = 0xffffffff;
      VP8BitWriterInit(&best.bw,0);
      uVar16 = 0xf;
      goto LAB_00136a9f;
    }
    best.score = 0xffffffff;
    VP8BitWriterInit(&best.bw,0);
LAB_00136a53:
    iVar10 = EncodeAlphaInternal(dst,dst_stride,height,method,0,(uint)((int)uVar1 < 100),
                                 effort_level,(uint8_t *)0x0,&best);
  }
  local_268 = &best.bw;
  if (iVar10 == 0) {
    VP8BitWriterWipeOut(local_268);
    bVar9 = true;
    puVar14 = (uint8_t *)0x0;
    best.bw.pos_ = 0;
  }
  else {
    if (lVar18 != 0) {
      *(undefined8 *)(lVar18 + 0x94) = best.stats._148_8_;
      *(undefined8 *)(lVar18 + 0x9c) = best.stats._156_8_;
      *(undefined8 *)(lVar18 + 0xa4) = best.stats._164_8_;
      *(undefined8 *)(lVar18 + 0xac) = best.stats._172_8_;
    }
    bVar9 = false;
    puVar14 = best.bw.buf_;
  }
LAB_00136be9:
  piVar4 = *(int **)(lVar3 + 0x80);
  if (piVar4 != (int *)0x0) {
    *piVar4 = *piVar4 + (int)best.bw.pos_;
    *(uint64_t *)((long)arg1 + 0x5bf0) = local_240;
  }
  WebPSafeFree(dst);
  if (!bVar9) {
    if (best.bw.pos_ >> 0x20 != 0) {
      WebPSafeFree(puVar14);
      return 0;
    }
    *(int *)((long)arg1 + 0x228) = (int)best.bw.pos_;
    *(uint8_t **)((long)arg1 + 0x220) = puVar14;
    return 1;
  }
  return 0;
}

Assistant:

static int CompressAlphaJob(void* arg1, void* unused) {
  VP8Encoder* const enc = (VP8Encoder*)arg1;
  const WebPConfig* config = enc->config_;
  uint8_t* alpha_data = NULL;
  size_t alpha_size = 0;
  const int effort_level = config->method;  // maps to [0..6]
  const WEBP_FILTER_TYPE filter =
      (config->alpha_filtering == 0) ? WEBP_FILTER_NONE :
      (config->alpha_filtering == 1) ? WEBP_FILTER_FAST :
                                       WEBP_FILTER_BEST;
  if (!EncodeAlpha(enc, config->alpha_quality, config->alpha_compression,
                   filter, effort_level, &alpha_data, &alpha_size)) {
    return 0;
  }
  if (alpha_size != (uint32_t)alpha_size) {  // Soundness check.
    WebPSafeFree(alpha_data);
    return 0;
  }
  enc->alpha_data_size_ = (uint32_t)alpha_size;
  enc->alpha_data_ = alpha_data;
  (void)unused;
  return 1;
}